

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadLayerOffset(CrateReader *this,LayerOffset *d)

{
  StreamReader *pSVar1;
  uint64_t uVar2;
  size_t nbytes_1;
  size_t nbytes;
  size_t sVar3;
  
  pSVar1 = this->_sr;
  uVar2 = pSVar1->idx_;
  sVar3 = pSVar1->length_ - uVar2;
  if (uVar2 + 8 <= pSVar1->length_) {
    sVar3 = 8;
  }
  if (sVar3 - 1 < 8) {
    memcpy(d,pSVar1->binary_ + uVar2,sVar3);
    pSVar1->idx_ = pSVar1->idx_ + sVar3;
    pSVar1 = this->_sr;
    uVar2 = pSVar1->idx_;
    sVar3 = 8;
    if (pSVar1->length_ < uVar2 + 8) {
      sVar3 = pSVar1->length_ - uVar2;
    }
    if (sVar3 - 1 < 8) {
      memcpy(&d->_scale,pSVar1->binary_ + uVar2,sVar3);
      pSVar1->idx_ = pSVar1->idx_ + sVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool CrateReader::ReadLayerOffset(LayerOffset *d) {
  static_assert(sizeof(LayerOffset) == 8 * 2, "LayerOffset must be 16bytes");

  // double x 2
  if (!_sr->read(sizeof(double), sizeof(double), reinterpret_cast<uint8_t *>(&(d->_offset)))) {
    return false;
  }
  if (!_sr->read(sizeof(double), sizeof(double), reinterpret_cast<uint8_t *>(&(d->_scale)))) {
    return false;
  }

  return true;
}